

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<true>::Bool(VWReaderHandler<true> *this,bool v)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte in_SIL;
  Context<true> *in_RDI;
  
  iVar2 = (*in_RDI->current_state->_vptr_BaseState[1])
                    (in_RDI->current_state,in_RDI,(ulong)(in_SIL & 1));
  bVar1 = Context<true>::TransitionState(in_RDI,(BaseState<true> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Bool(bool v) { return ctx.TransitionState(ctx.current_state->Bool(ctx, v)); }